

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::anon_unknown_22::PosixColourImpl::use(PosixColourImpl *this,Code _colourCode)

{
  logic_error *this_00;
  Code _colourCode_local;
  PosixColourImpl *this_local;
  
  switch(_colourCode) {
  case None:
  case Headers:
    setColour(this,"[0m");
    break;
  case Red:
    setColour(this,"[0;31m");
    break;
  case Green:
    setColour(this,"[0;32m");
    break;
  case Blue:
    setColour(this,"[0:34m");
    break;
  case Cyan:
    setColour(this,"[0;36m");
    break;
  case ReconstructedExpression:
    setColour(this,"[0;33m");
    break;
  case Grey:
    setColour(this,"[1;30m");
    break;
  case Bright:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"not a colour");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  case BrightWhite:
    setColour(this,"[1;37m");
    break;
  case BrightRed:
    setColour(this,"[1;31m");
    break;
  case BrightGreen:
    setColour(this,"[1;32m");
    break;
  case FileName:
    setColour(this,"[0;37m");
  }
  return;
}

Assistant:

virtual void use( Colour::Code _colourCode ) {
            switch( _colourCode ) {
                case Colour::None:
                case Colour::White:     return setColour( "[0m" );
                case Colour::Red:       return setColour( "[0;31m" );
                case Colour::Green:     return setColour( "[0;32m" );
                case Colour::Blue:      return setColour( "[0:34m" );
                case Colour::Cyan:      return setColour( "[0;36m" );
                case Colour::Yellow:    return setColour( "[0;33m" );
                case Colour::Grey:      return setColour( "[1;30m" );

                case Colour::LightGrey:     return setColour( "[0;37m" );
                case Colour::BrightRed:     return setColour( "[1;31m" );
                case Colour::BrightGreen:   return setColour( "[1;32m" );
                case Colour::BrightWhite:   return setColour( "[1;37m" );

                case Colour::Bright: throw std::logic_error( "not a colour" );
            }
        }